

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

void __thiscall
SQOuterVar::SQOuterVar(SQOuterVar *this,SQObjectPtr *name,SQObjectPtr *src,SQOuterType t)

{
  SQOuterType t_local;
  SQObjectPtr *src_local;
  SQObjectPtr *name_local;
  SQOuterVar *this_local;
  
  ::SQObjectPtr::SQObjectPtr(&this->_name);
  ::SQObjectPtr::SQObjectPtr(&this->_src);
  ::SQObjectPtr::operator=(&this->_name,name);
  ::SQObjectPtr::operator=(&this->_src,src);
  this->_type = t;
  return;
}

Assistant:

SQOuterVar(const SQObjectPtr &name,const SQObjectPtr &src,SQOuterType t)
    {
        _name = name;
        _src=src;
        _type=t;
    }